

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void __thiscall
pybind11::detail::loader_life_support::~loader_life_support(loader_life_support *this)

{
  pointer pp_Var1;
  _object *p_Var2;
  pointer pp_Var3;
  pointer pp_Var4;
  internals *piVar5;
  ulong uVar6;
  
  piVar5 = get_internals();
  pp_Var1 = (piVar5->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((piVar5->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>.
      _M_impl.super__Vector_impl_data._M_start == pp_Var1) {
    pybind11_fail("loader_life_support: internal error");
  }
  p_Var2 = pp_Var1[-1];
  (piVar5->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = pp_Var1 + -1;
  if ((p_Var2 != (_object *)0x0) &&
     (p_Var2->ob_refcnt = p_Var2->ob_refcnt + -1, p_Var2->ob_refcnt == 0)) {
    _Py_Dealloc();
  }
  pp_Var1 = (piVar5->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pp_Var3 = (piVar5->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar6 = (long)pp_Var3 - (long)pp_Var1 >> 3;
  if ((((0x10 < uVar6) &&
       (pp_Var4 = (piVar5->loader_patient_stack).
                  super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
                  super__Vector_impl_data._M_finish, pp_Var1 != pp_Var4)) && (pp_Var3 != pp_Var4))
     && (2 < uVar6 / (ulong)((long)pp_Var4 - (long)pp_Var1 >> 3))) {
    std::__shrink_to_fit_aux<std::vector<_object_*,_std::allocator<_object_*>_>,_true>::_S_do_it
              (&piVar5->loader_patient_stack);
    return;
  }
  return;
}

Assistant:

~loader_life_support() {
        auto &stack = get_internals().loader_patient_stack;
        if (stack.empty())
            pybind11_fail("loader_life_support: internal error");

        auto ptr = stack.back();
        stack.pop_back();
        Py_CLEAR(ptr);

        // A heuristic to reduce the stack's capacity (e.g. after long recursive calls)
        if (stack.capacity() > 16 && !stack.empty() && stack.capacity() / stack.size() > 2)
            stack.shrink_to_fit();
    }